

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::UnitTest::AddTestPartResult
          (UnitTest *this,Type result_type,char *file_name,int line_number,String *message,
          String *os_stack_trace)

{
  undefined1 uVar1;
  internal iVar2;
  char *pcVar3;
  bool bVar4;
  Type TVar5;
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *pvVar6;
  TestPartResultReporterInterface **ppTVar7;
  GoogleTestFailureException *this_00;
  pointer pTVar8;
  ostream *poVar9;
  size_t sVar10;
  UnitTest *pUVar11;
  pointer pTVar12;
  uint uVar13;
  ulong uVar14;
  TestPartResult result;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  MutexBase *local_a8;
  String *local_a0;
  int local_98;
  Type local_94;
  UnitTest *local_90;
  internal local_88;
  undefined7 uStack_87;
  TestPartResult local_78;
  char *local_38;
  
  local_a0 = os_stack_trace;
  local_98 = line_number;
  local_94 = result_type;
  local_90 = this;
  local_38 = file_name;
  Message::Message((Message *)&local_b0);
  poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
  if (local_b0.ptr_ == (stringstream *)0x0) {
    poVar9 = (ostream *)0x0;
  }
  pcVar3 = message->c_str_;
  if (pcVar3 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
  }
  else if (message->length_ != 0) {
    sVar10 = 0;
    do {
      uVar1 = pcVar3[sVar10];
      if (uVar1 == kSuccess) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
      }
      else {
        local_78.type_._0_1_ = uVar1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_78,1);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != message->length_);
  }
  pUVar11 = local_90;
  local_a8 = &(local_90->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_a8);
  pvVar6 = internal::
           ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
           ::GetOrCreateValue(&pUVar11->impl_->gtest_trace_stack_);
  pTVar8 = (pvVar6->
           super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar8 != (pvVar6->
                super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
    if (local_b0.ptr_ == (stringstream *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
    if (local_b0.ptr_ == (stringstream *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Google Test",0xb);
    poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
    if (local_b0.ptr_ == (stringstream *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," trace:",7);
    pvVar6 = internal::
             ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
             ::GetOrCreateValue(&pUVar11->impl_->gtest_trace_stack_);
    uVar13 = (uint)((ulong)((long)(pvVar6->
                                  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar6->
                                 super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (0 < (int)uVar13) {
      uVar14 = (ulong)(uVar13 & 0x7fffffff);
      do {
        pvVar6 = internal::
                 ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
                 ::GetOrCreateValue(&pUVar11->impl_->gtest_trace_stack_);
        pTVar12 = (pvVar6->
                  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start + (uVar14 - 1);
        poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
        if (local_b0.ptr_ == (stringstream *)0x0) {
          poVar9 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        internal::FormatFileLocation_abi_cxx11_
                  ((string *)&local_78,(internal *)pTVar12->file,(char *)(ulong)(uint)pTVar12->line,
                   (int)pTVar8);
        poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
        if (local_b0.ptr_ == (stringstream *)0x0) {
          poVar9 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,(char *)CONCAT71(local_78._1_7_,(undefined1)local_78.type_),
                   (long)local_78.file_name_.c_str_);
        poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
        if (local_b0.ptr_ == (stringstream *)0x0) {
          poVar9 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
        poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
        if (local_b0.ptr_ == (stringstream *)0x0) {
          poVar9 = (ostream *)0x0;
        }
        pcVar3 = (pTVar12->message).c_str_;
        if (pcVar3 == (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
        }
        else if ((pTVar12->message).length_ != 0) {
          sVar10 = 0;
          do {
            iVar2 = *(internal *)(pcVar3 + sVar10);
            if (iVar2 == (internal)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
            }
            else {
              local_88 = iVar2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_88,1);
            }
            sVar10 = sVar10 + 1;
          } while (sVar10 != (pTVar12->message).length_);
        }
        if ((size_t *)CONCAT71(local_78._1_7_,(undefined1)local_78.type_) !=
            &local_78.file_name_.length_) {
          operator_delete((undefined1 *)CONCAT71(local_78._1_7_,(undefined1)local_78.type_));
        }
        bVar4 = 1 < (long)uVar14;
        pUVar11 = local_90;
        uVar14 = uVar14 - 1;
      } while (bVar4);
    }
  }
  if ((local_a0->c_str_ != (char *)0x0) && (local_a0->length_ != 0)) {
    poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
    if (local_b0.ptr_ == (stringstream *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nStack trace:\n",0xe);
    poVar9 = (ostream *)(local_b0.ptr_ + 0x10);
    if (local_b0.ptr_ == (stringstream *)0x0) {
      poVar9 = (ostream *)0x0;
    }
    pcVar3 = local_a0->c_str_;
    if (pcVar3 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(null)",6);
    }
    else if (local_a0->length_ != 0) {
      sVar10 = 0;
      do {
        uVar1 = pcVar3[sVar10];
        if (uVar1 == kSuccess) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\\0",2);
        }
        else {
          local_78.type_._0_1_ = uVar1;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_78,1);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != local_a0->length_);
    }
  }
  internal::StringStreamToString(&local_88,local_b0.ptr_);
  TVar5 = local_94;
  TestPartResult::TestPartResult
            (&local_78,local_94,local_38,local_98,(char *)CONCAT71(uStack_87,local_88));
  if ((void *)CONCAT71(uStack_87,local_88) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(uStack_87,local_88));
  }
  ppTVar7 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (&pUVar11->impl_->per_thread_test_part_result_reporter_);
  (*(*ppTVar7)->_vptr_TestPartResultReporterInterface[2])(*ppTVar7,&local_78);
  if (TVar5 != kSuccess) {
    if (FLAGS_gtest_break_on_failure == '\x01') {
      _DAT_00000000 = 1;
    }
    else if (FLAGS_gtest_throw_on_failure == '\x01') {
      this_00 = (GoogleTestFailureException *)__cxa_allocate_exception(0x10);
      GoogleTestFailureException::GoogleTestFailureException(this_00,&local_78);
      __cxa_throw(this_00,&GoogleTestFailureException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_78.message_.c_str_ != (char *)0x0) {
    operator_delete__(local_78.message_.c_str_);
  }
  if (local_78.summary_.c_str_ != (char *)0x0) {
    operator_delete__(local_78.summary_.c_str_);
  }
  if (local_78.file_name_.c_str_ != (char *)0x0) {
    operator_delete__(local_78.file_name_.c_str_);
  }
  internal::MutexBase::Unlock(local_a8);
  if (local_b0.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_b0.ptr_ + 8))();
  }
  return;
}

Assistant:

void UnitTest::AddTestPartResult(TestPartResult::Type result_type,
                                 const char* file_name,
                                 int line_number,
                                 const internal::String& message,
                                 const internal::String& os_stack_trace) {
  Message msg;
  msg << message;

  internal::MutexLock lock(&mutex_);
  if (impl_->gtest_trace_stack().size() > 0) {
    msg << "\n" << GTEST_NAME_ << " trace:";

    for (int i = static_cast<int>(impl_->gtest_trace_stack().size());
         i > 0; --i) {
      const internal::TraceInfo& trace = impl_->gtest_trace_stack()[i - 1];
      msg << "\n" << internal::FormatFileLocation(trace.file, trace.line)
          << " " << trace.message;
    }
  }

  if (os_stack_trace.c_str() != NULL && !os_stack_trace.empty()) {
    msg << internal::kStackTraceMarker << os_stack_trace;
  }

  const TestPartResult result =
    TestPartResult(result_type, file_name, line_number,
                   msg.GetString().c_str());
  impl_->GetTestPartResultReporterForCurrentThread()->
      ReportTestPartResult(result);

  if (result_type != TestPartResult::kSuccess) {
    // gtest_break_on_failure takes precedence over
    // gtest_throw_on_failure.  This allows a user to set the latter
    // in the code (perhaps in order to use Google Test assertions
    // with another testing framework) and specify the former on the
    // command line for debugging.
    if (GTEST_FLAG(break_on_failure)) {
#if GTEST_OS_WINDOWS
      // Using DebugBreak on Windows allows gtest to still break into a debugger
      // when a failure happens and both the --gtest_break_on_failure and
      // the --gtest_catch_exceptions flags are specified.
      DebugBreak();
#else
      // Dereference NULL through a volatile pointer to prevent the compiler
      // from removing. We use this rather than abort() or __builtin_trap() for
      // portability: Symbian doesn't implement abort() well, and some debuggers
      // don't correctly trap abort().
      *static_cast<volatile int*>(NULL) = 1;
#endif  // GTEST_OS_WINDOWS
    } else if (GTEST_FLAG(throw_on_failure)) {
#if GTEST_HAS_EXCEPTIONS
      throw GoogleTestFailureException(result);
#else
      // We cannot call abort() as it generates a pop-up in debug mode
      // that cannot be suppressed in VC 7.1 or below.
      exit(1);
#endif
    }
  }
}